

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConstraintsGroup.cpp
# Opt level: O2

bool __thiscall
iDynTree::optimalcontrol::ConstraintsGroup::constraintSecondPartialDerivativeWRTStateControl
          (ConstraintsGroup *this,double time,VectorDynSize *state,VectorDynSize *control,
          VectorDynSize *lambda,MatrixDynSize *hessian)

{
  element_type *peVar1;
  element_type *peVar2;
  long *plVar3;
  bool bVar4;
  char cVar5;
  int iVar6;
  long lVar7;
  long lVar8;
  ostream *poVar9;
  string *psVar10;
  ulong uVar11;
  reverse_iterator constraintIterator;
  TimedConstraint_ptr loneConstraint;
  ostringstream errorMsg;
  undefined1 local_1f0 [8];
  Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_> local_1e8;
  double local_1c8;
  undefined1 local_1c0 [24];
  Block<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,__1,_1,_false>
  local_1a8 [5];
  
  local_1c8 = time;
  bVar4 = isAnyTimeGroup(this);
  if (!bVar4) {
    uVar11 = iDynTree::VectorDynSize::size();
    iDynTree::VectorDynSize::size();
    iDynTree::MatrixDynSize::resize((ulong)hessian,uVar11);
    ConstraintsGroupPimpl::findActiveConstraint((ConstraintsGroupPimpl *)local_1f0,local_1c8);
    if (local_1f0 ==
        (undefined1  [8])
        (this->m_pimpl->orderedIntervals).
        super__Vector_base<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>,_std::allocator<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      toEigen((Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_> *)local_1a8,
              hessian);
      Eigen::
      DenseBase<Eigen::Map<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>_>::
      setZero((DenseBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>
               *)local_1a8);
      return true;
    }
    toEigen(&local_1e8,lambda);
    local_1a8[0].
    super_BlockImpl<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,__1,_1,_false,_Eigen::Dense>
    .
    super_BlockImpl_dense<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,__1,_1,_false,_true>
    .
    super_MapBase<Eigen::Block<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,__1,_1,_false>,_0>
    .m_rows.m_value = iDynTree::VectorDynSize::size();
    local_1a8[0].
    super_BlockImpl<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,__1,_1,_false,_Eigen::Dense>
    .
    super_BlockImpl_dense<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,__1,_1,_false,_true>
    .
    super_MapBase<Eigen::Block<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,__1,_1,_false>,_0>
    .m_data = local_1e8.
              super_MapBase<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>
              .m_data;
    local_1a8[0].
    super_BlockImpl<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,__1,_1,_false,_Eigen::Dense>
    .
    super_BlockImpl_dense<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,__1,_1,_false,_true>
    .m_xpr.
    super_MapBase<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>
    .m_data = local_1e8.
              super_MapBase<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>
              .m_data;
    local_1a8[0].
    super_BlockImpl<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,__1,_1,_false,_Eigen::Dense>
    .
    super_BlockImpl_dense<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,__1,_1,_false,_true>
    .m_xpr.
    super_MapBase<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>
    .m_rows.m_value =
         local_1e8.
         super_MapBase<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>
         .m_rows.m_value;
    local_1a8[0].
    super_BlockImpl<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,__1,_1,_false,_Eigen::Dense>
    .
    super_BlockImpl_dense<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,__1,_1,_false,_true>
    .m_xpr.
    super_MapBase<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>
    ._16_1_ = local_1e8.
              super_MapBase<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>
              ._16_1_;
    local_1a8[0].
    super_BlockImpl<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,__1,_1,_false,_Eigen::Dense>
    .
    super_BlockImpl_dense<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,__1,_1,_false,_true>
    .m_startRow.m_value = 0;
    local_1a8[0].
    super_BlockImpl<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,__1,_1,_false,_Eigen::Dense>
    .
    super_BlockImpl_dense<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,__1,_1,_false,_true>
    .m_outerStride =
         local_1e8.
         super_MapBase<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>
         .m_rows.m_value;
    toEigen((Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_> *)local_1c0,
            &((((pointer)((long)local_1f0 + -0x10))->
              super___shared_ptr<iDynTree::optimalcontrol::TimedConstraint,_(__gnu_cxx::_Lock_policy)2>
              )._M_ptr)->lambdaBuffer);
    Eigen::internal::
    call_assignment<Eigen::Map<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::Stride<0,0>>,Eigen::Block<Eigen::Map<Eigen::Matrix<double,_1,1,0,_1,1>const,0,Eigen::Stride<0,0>>,_1,1,false>>
              ((Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_> *)local_1c0,
               local_1a8);
    peVar2 = (((pointer)((long)local_1f0 + -0x10))->
             super___shared_ptr<iDynTree::optimalcontrol::TimedConstraint,_(__gnu_cxx::_Lock_policy)2>
             )._M_ptr;
    plVar3 = *(long **)&peVar2->constraint;
    cVar5 = (**(code **)(*plVar3 + 0x60))
                      (SUB84(local_1c8,0),plVar3,state,control,&peVar2->lambdaBuffer,hessian);
    if (cVar5 == '\0') {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      poVar9 = std::operator<<((ostream *)local_1a8,"Failed to evaluate ");
      psVar10 = Constraint::name_abi_cxx11_
                          (*(Constraint **)
                            &((((pointer)((long)local_1f0 + -0x10))->
                              super___shared_ptr<iDynTree::optimalcontrol::TimedConstraint,_(__gnu_cxx::_Lock_policy)2>
                              )._M_ptr)->constraint);
      poVar9 = std::operator<<(poVar9,(string *)psVar10);
      std::endl<char,std::char_traits<char>>(poVar9);
      std::__cxx11::stringbuf::str();
      iDynTree::reportError
                ("ConstraintsGroup","constraintSecondPartialDerivativeWRTStateControl",
                 (char *)local_1e8.
                         super_MapBase<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>
                         .m_data);
    }
    else {
      lVar7 = iDynTree::MatrixDynSize::rows();
      lVar8 = iDynTree::VectorDynSize::size();
      if (lVar7 == lVar8) {
        lVar7 = iDynTree::MatrixDynSize::cols();
        lVar8 = iDynTree::VectorDynSize::size();
        if (lVar7 == lVar8) {
          return true;
        }
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
        poVar9 = std::operator<<((ostream *)local_1a8,
                                 "The second partial derivative WRT state/control of constraint ");
        psVar10 = Constraint::name_abi_cxx11_
                            (*(Constraint **)
                              &((((pointer)((long)local_1f0 + -0x10))->
                                super___shared_ptr<iDynTree::optimalcontrol::TimedConstraint,_(__gnu_cxx::_Lock_policy)2>
                                )._M_ptr)->constraint);
        poVar9 = std::operator<<(poVar9,(string *)psVar10);
        poVar9 = std::operator<<(poVar9,
                                 " has a number of columns different from the size of the control.")
        ;
        std::endl<char,std::char_traits<char>>(poVar9);
        std::__cxx11::stringbuf::str();
        iDynTree::reportError
                  ("ConstraintsGroup","constraintSecondPartialDerivativeWRTStateControl",
                   (char *)local_1e8.
                           super_MapBase<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>
                           .m_data);
      }
      else {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
        poVar9 = std::operator<<((ostream *)local_1a8,
                                 "The second partial derivative WRT state/control of constraint ");
        psVar10 = Constraint::name_abi_cxx11_
                            (*(Constraint **)
                              &((((pointer)((long)local_1f0 + -0x10))->
                                super___shared_ptr<iDynTree::optimalcontrol::TimedConstraint,_(__gnu_cxx::_Lock_policy)2>
                                )._M_ptr)->constraint);
        poVar9 = std::operator<<(poVar9,(string *)psVar10);
        poVar9 = std::operator<<(poVar9,
                                 " has a number of rows different from the size of the state.");
        std::endl<char,std::char_traits<char>>(poVar9);
        std::__cxx11::stringbuf::str();
        iDynTree::reportError
                  ("ConstraintsGroup","constraintSecondPartialDerivativeWRTStateControl",
                   (char *)local_1e8.
                           super_MapBase<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>
                           .m_data);
      }
    }
    std::__cxx11::string::~string((string *)&local_1e8);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    return false;
  }
  std::__shared_ptr<iDynTree::optimalcontrol::TimedConstraint,_(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr((__shared_ptr<iDynTree::optimalcontrol::TimedConstraint,_(__gnu_cxx::_Lock_policy)2>
                *)local_1c0,
               (__shared_ptr<iDynTree::optimalcontrol::TimedConstraint,_(__gnu_cxx::_Lock_policy)2>
                *)((this->m_pimpl->group)._M_h._M_before_begin._M_nxt + 5));
  peVar1 = (((shared_ptr<iDynTree::optimalcontrol::Constraint> *)local_1c0._0_8_)->
           super___shared_ptr<iDynTree::optimalcontrol::Constraint,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
  iVar6 = (*peVar1->_vptr_Constraint[0xc])(SUB84(local_1c8,0),peVar1,state,control,lambda,hessian);
  if ((char)iVar6 == '\0') {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    poVar9 = std::operator<<((ostream *)local_1a8,"Failed to evaluate ");
    psVar10 = Constraint::name_abi_cxx11_
                        ((((shared_ptr<iDynTree::optimalcontrol::Constraint> *)local_1c0._0_8_)->
                         super___shared_ptr<iDynTree::optimalcontrol::Constraint,_(__gnu_cxx::_Lock_policy)2>
                         )._M_ptr);
    poVar9 = std::operator<<(poVar9,(string *)psVar10);
    std::endl<char,std::char_traits<char>>(poVar9);
    std::__cxx11::stringbuf::str();
    iDynTree::reportError
              ("ConstraintsGroup","constraintSecondPartialDerivativeWRTStateControl",
               (char *)local_1e8.
                       super_MapBase<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>
                       .m_data);
  }
  else {
    lVar7 = iDynTree::MatrixDynSize::rows();
    lVar8 = iDynTree::VectorDynSize::size();
    if (lVar7 == lVar8) {
      lVar7 = iDynTree::MatrixDynSize::cols();
      lVar8 = iDynTree::VectorDynSize::size();
      bVar4 = true;
      if (lVar7 == lVar8) goto LAB_001aca44;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      poVar9 = std::operator<<((ostream *)local_1a8,
                               "The second partial derivative WRT state/control of constraint ");
      psVar10 = Constraint::name_abi_cxx11_
                          ((((shared_ptr<iDynTree::optimalcontrol::Constraint> *)local_1c0._0_8_)->
                           super___shared_ptr<iDynTree::optimalcontrol::Constraint,_(__gnu_cxx::_Lock_policy)2>
                           )._M_ptr);
      poVar9 = std::operator<<(poVar9,(string *)psVar10);
      poVar9 = std::operator<<(poVar9,
                               " has a number of columns different from the size of the control.");
      std::endl<char,std::char_traits<char>>(poVar9);
      std::__cxx11::stringbuf::str();
      iDynTree::reportError
                ("ConstraintsGroup","constraintSecondPartialDerivativeWRTStateControl",
                 (char *)local_1e8.
                         super_MapBase<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>
                         .m_data);
    }
    else {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      poVar9 = std::operator<<((ostream *)local_1a8,
                               "The second partial derivative WRT state/control of constraint ");
      psVar10 = Constraint::name_abi_cxx11_
                          ((((shared_ptr<iDynTree::optimalcontrol::Constraint> *)local_1c0._0_8_)->
                           super___shared_ptr<iDynTree::optimalcontrol::Constraint,_(__gnu_cxx::_Lock_policy)2>
                           )._M_ptr);
      poVar9 = std::operator<<(poVar9,(string *)psVar10);
      poVar9 = std::operator<<(poVar9," has a number of rows different from the size of the state.")
      ;
      std::endl<char,std::char_traits<char>>(poVar9);
      std::__cxx11::stringbuf::str();
      iDynTree::reportError
                ("ConstraintsGroup","constraintSecondPartialDerivativeWRTStateControl",
                 (char *)local_1e8.
                         super_MapBase<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>
                         .m_data);
    }
  }
  std::__cxx11::string::~string((string *)&local_1e8);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  bVar4 = false;
LAB_001aca44:
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_1c0 + 8));
  return bVar4;
}

Assistant:

bool ConstraintsGroup::constraintSecondPartialDerivativeWRTStateControl(double time, const VectorDynSize &state, const VectorDynSize &control, const VectorDynSize &lambda, MatrixDynSize &hessian)
        {
            if (isAnyTimeGroup()){
                TimedConstraint_ptr loneConstraint = m_pimpl->group.begin()->second;
                if (!(loneConstraint->constraint->constraintSecondPartialDerivativeWRTStateControl(time, state, control, lambda, hessian))) {
                    std::ostringstream errorMsg;
                    errorMsg << "Failed to evaluate "<< loneConstraint->constraint->name() << std::endl;
                    reportError("ConstraintsGroup", "constraintSecondPartialDerivativeWRTStateControl", errorMsg.str().c_str());
                    return false;
                }

                if (hessian.rows() != state.size()) {
                    std::ostringstream errorMsg;
                    errorMsg << "The second partial derivative WRT state/control of constraint "<< loneConstraint->constraint->name() << " has a number of rows different from the size of the state." << std::endl;
                    reportError("ConstraintsGroup", "constraintSecondPartialDerivativeWRTStateControl", errorMsg.str().c_str());
                    return false;
                }

                if (hessian.cols() != control.size()) {
                    std::ostringstream errorMsg;
                    errorMsg << "The second partial derivative WRT state/control of constraint "<< loneConstraint->constraint->name() << " has a number of columns different from the size of the control." << std::endl;
                    reportError("ConstraintsGroup", "constraintSecondPartialDerivativeWRTStateControl", errorMsg.str().c_str());
                    return false;
                }

                return true;
            }

            hessian.resize(state.size(), control.size());

            std::vector< TimedConstraint_ptr >::reverse_iterator constraintIterator = m_pimpl->findActiveConstraint(time);
            if (constraintIterator == m_pimpl->orderedIntervals.rend()){ //no active constraint
                toEigen(hessian).setZero();
                return true;
            }

            toEigen(constraintIterator->get()->lambdaBuffer) = toEigen(lambda).topRows(constraintIterator->get()->lambdaBuffer.size());

            if (!(constraintIterator->get()->constraint->constraintSecondPartialDerivativeWRTStateControl(time, state, control, constraintIterator->get()->lambdaBuffer, hessian))) {
                std::ostringstream errorMsg;
                errorMsg << "Failed to evaluate "<< constraintIterator->get()->constraint->name() << std::endl;
                reportError("ConstraintsGroup", "constraintSecondPartialDerivativeWRTStateControl", errorMsg.str().c_str());
                return false;
            }

            if (hessian.rows() != state.size()) {
                std::ostringstream errorMsg;
                errorMsg << "The second partial derivative WRT state/control of constraint "<< constraintIterator->get()->constraint->name() << " has a number of rows different from the size of the state." << std::endl;
                reportError("ConstraintsGroup", "constraintSecondPartialDerivativeWRTStateControl", errorMsg.str().c_str());
                return false;
            }

            if (hessian.cols() != control.size()) {
                std::ostringstream errorMsg;
                errorMsg << "The second partial derivative WRT state/control of constraint "<< constraintIterator->get()->constraint->name() << " has a number of columns different from the size of the control." << std::endl;
                reportError("ConstraintsGroup", "constraintSecondPartialDerivativeWRTStateControl", errorMsg.str().c_str());
                return false;
            }

            return true;
        }